

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O0

void __thiscall
glcts::GPUShader5TextureGatherOffsetTestBase::prepareVertexBufferInfoForCoordinates
          (GPUShader5TextureGatherOffsetTestBase *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  undefined1 local_68 [8];
  VertexBufferInfo info;
  GLfloat coord_y_1;
  GLfloat coord_x_1;
  uint i_1;
  GLfloat coord_z;
  GLfloat coord_y;
  GLfloat coord_x;
  uint i;
  float y_range;
  float y_offset;
  int y_modulus;
  float x_range;
  float x_offset;
  int x_modulus;
  float coordinate_denominator;
  GPUShader5TextureGatherOffsetTestBase *this_local;
  
  if ((this->m_is_texture_array & 1U) == 1) {
    this->m_n_coordinates_components = 3;
  }
  else {
    this->m_n_coordinates_components = 2;
  }
  std::vector<float,_std::allocator<float>_>::resize
            (&this->m_coordinates_buffer_data,(ulong)(this->m_n_coordinates_components << 7));
  if ((this->m_is_texture_array & 1U) == 1) {
    setCoordinatesData(this,0.0,0.0,0.0,0);
    setCoordinatesData(this,0.0,1.0,1.0,1);
    setCoordinatesData(this,1.0,0.0,2.0,2);
    setCoordinatesData(this,1.0,1.0,3.0,3);
    for (coord_y = 5.60519e-45; (uint)coord_y < 0x80; coord_y = (GLfloat)((int)coord_y + 1)) {
      iVar1 = rand();
      iVar2 = rand();
      uVar3 = rand();
      setCoordinatesData(this,(float)(iVar1 % 0x4000) * 0.0009765625 + -8.0,
                         (float)(iVar2 % 0x4000) * 0.0009765625 + -8.0,
                         (float)((uVar3 & 3) << 10) / 1024.0,(uint)coord_y);
    }
  }
  else {
    setCoordinatesData(this,0.0,0.0,0);
    setCoordinatesData(this,0.0,1.0,1);
    setCoordinatesData(this,1.0,0.0,2);
    setCoordinatesData(this,1.0,1.0,3);
    for (coord_y_1 = 5.60519e-45; (uint)coord_y_1 < 0x80; coord_y_1 = (GLfloat)((int)coord_y_1 + 1))
    {
      iVar1 = rand();
      info._28_4_ = (float)(iVar1 % 0x4000) / 1024.0 + -8.0;
      iVar1 = rand();
      info.data_size = (GLuint)((float)(iVar1 % 0x4000) / 1024.0 + -8.0);
      setCoordinatesData(this,(GLfloat)info._28_4_,(GLfloat)info.data_size,(uint)coord_y_1);
    }
  }
  local_68 = (undefined1  [8])0x2ad7e16;
  info.attribute_name._0_4_ = this->m_n_coordinates_components;
  info.attribute_name._4_4_ = 0x1406;
  info._8_8_ = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->m_coordinates_buffer_data,0);
  sVar4 = std::vector<float,_std::allocator<float>_>::size(&this->m_coordinates_buffer_data);
  info.data._0_4_ = (undefined4)(sVar4 << 2);
  std::
  vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
  ::push_back(&this->m_vertex_buffer_infos,(value_type *)local_68);
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetTestBase::prepareVertexBufferInfoForCoordinates()
{
	/* Select proper number of components */
	if (true == m_is_texture_array)
	{
		m_n_coordinates_components = 3;
	}
	else
	{
		m_n_coordinates_components = 2;
	}

	/* Prepare storage for texture coordinates */
	m_coordinates_buffer_data.resize(m_n_vertices * m_n_coordinates_components);

	/* Variables for calculation of texture coordiantes' range and offsets */
	const float coordinate_denominator = m_coordinate_resolution;
	int			x_modulus;
	float		x_offset;
	float		x_range;
	int			y_modulus;
	float		y_offset;
	float		y_range;

	/* Calculation of texture coordiantes' range and offsets */
	x_range = m_max_coordinate_value - m_min_coordinate_value;
	y_range = m_max_coordinate_value - m_min_coordinate_value;

	x_offset = m_min_coordinate_value;
	y_offset = m_min_coordinate_value;

	x_range *= coordinate_denominator;
	y_range *= coordinate_denominator;

	x_modulus = (int)x_range;
	y_modulus = (int)y_range;

	/* Prepare texture coordinates */
	if (true == m_is_texture_array)
	{
		/* First four coordinates are corners, each comes from unique level */
		setCoordinatesData(0.0f, 0.0f, 0.0f, 0);
		setCoordinatesData(0.0f, 1.0f, 1.0f, 1);
		setCoordinatesData(1.0f, 0.0f, 2.0f, 2);
		setCoordinatesData(1.0f, 1.0f, 3.0f, 3);

		/* Generate rest of texture coordinates */
		for (unsigned int i = 4; i < m_n_vertices; ++i)
		{
			const glw::GLfloat coord_x = ((float)(rand() % x_modulus)) / coordinate_denominator + x_offset;
			const glw::GLfloat coord_y = ((float)(rand() % y_modulus)) / coordinate_denominator + y_offset;
			const glw::GLfloat coord_z =
				((float)(rand() % m_n_texture_array_length * m_coordinate_resolution)) / coordinate_denominator;

			setCoordinatesData(coord_x, coord_y, coord_z, i);
		}
	}
	else
	{
		/* First four coordinates are corners */
		setCoordinatesData(0.0f, 0.0f, 0);
		setCoordinatesData(0.0f, 1.0f, 1);
		setCoordinatesData(1.0f, 0.0f, 2);
		setCoordinatesData(1.0f, 1.0f, 3);

		/* Generate rest of texture coordinates */
		for (unsigned int i = 4; i < m_n_vertices; ++i)
		{
			const glw::GLfloat coord_x = ((float)(rand() % x_modulus)) / coordinate_denominator + x_offset;
			const glw::GLfloat coord_y = ((float)(rand() % y_modulus)) / coordinate_denominator + y_offset;

			setCoordinatesData(coord_x, coord_y, i);
		}
	}

	/* Setup coordinates VB info */
	VertexBufferInfo info;

	info.attribute_name = m_coordinates_attribute_name;
	info.n_components   = m_n_coordinates_components;
	info.type			= GL_FLOAT;
	info.data			= &m_coordinates_buffer_data[0];
	info.data_size		= (glw::GLuint)(m_coordinates_buffer_data.size() * sizeof(glw::GLfloat));

	/* Store results */
	m_vertex_buffer_infos.push_back(info);
}